

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

int __thiscall deqp::gls::DrawTest::init(DrawTest *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *pRVar1;
  TestContext *pTVar2;
  Context *drawContext;
  bool bVar3;
  int iVar4;
  uint x_;
  uint y_;
  deInt32 dVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GLContext *this_00;
  TestLog *log;
  ReferenceContextBuffers *this_01;
  undefined4 extraout_var_02;
  PixelFormat *pPVar6;
  ReferenceContext *pRVar7;
  AttributePack *pAVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  bool local_17e;
  byte local_149;
  Vector<unsigned_int,_2> local_148;
  Vector<unsigned_int,_2> local_140;
  MultisamplePixelBufferAccess local_138;
  MultisamplePixelBufferAccess local_110;
  MultisamplePixelBufferAccess local_e8;
  ApiType local_c0;
  deUint32 local_bc;
  ContextType local_b8;
  deUint32 local_b4;
  ContextType local_b0;
  ApiType local_ac;
  deUint32 local_a8;
  ContextType local_a4;
  ApiType local_a0;
  Vector<int,_4> local_9c [2];
  byte local_79;
  undefined1 local_78 [7];
  bool useVao;
  ReferenceContextLimits limits;
  int renderTargetSamples;
  bool isMSAACase;
  bool isLineCase;
  int renderTargetHeight;
  int renderTargetWidth;
  DrawTest *this_local;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
  x_ = de::min<int>(0x200,iVar4);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar4));
  y_ = de::min<int>(0x200,iVar4);
  limits.extensionStr.field_2._M_local_buf[0xf] = containsLineCases(&this->m_specs);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var_01,iVar4));
  limits.extensionStr.field_2._M_local_buf[0xe] = 1 < iVar4;
  local_149 = 0;
  if ((bool)limits.extensionStr.field_2._M_local_buf[0xe]) {
    local_149 = limits.extensionStr.field_2._M_local_buf[0xf];
  }
  limits.extensionStr.field_2._8_4_ = (local_149 & 1) * 3 + 1;
  sglr::ReferenceContextLimits::ReferenceContextLimits
            ((ReferenceContextLimits *)local_78,this->m_renderCtx);
  local_79 = 0;
  this_00 = (GLContext *)operator_new(0x170);
  pRVar1 = this->m_renderCtx;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::Vector<int,_4>::Vector(local_9c,0,0,x_,y_);
  sglr::GLContext::GLContext(this_00,pRVar1,log,3,local_9c);
  this->m_glesContext = (Context *)this_00;
  local_a4.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  local_a0 = glu::ContextType::getAPI(&local_a4);
  local_a8 = (deUint32)glu::ApiType::es(2,0);
  bVar3 = glu::ApiType::operator==(&local_a0,(ApiType)local_a8);
  local_17e = true;
  if (!bVar3) {
    local_b0.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    local_ac = glu::ContextType::getAPI(&local_b0);
    local_b4 = (deUint32)glu::ApiType::es(3,0);
    local_17e = glu::ApiType::operator==(&local_ac,(ApiType)local_b4);
  }
  if (local_17e == false) {
    local_b8.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    local_bc = (deUint32)glu::ApiType::es(3,1);
    bVar3 = glu::contextSupports(local_b8,(ApiType)local_bc);
    if (!bVar3) {
      local_c0.m_bits = (*this->m_renderCtx->_vptr_RenderContext[2])();
      bVar3 = glu::isContextTypeGLCore((ContextType)local_c0.m_bits);
      if (!bVar3) goto LAB_00f8b428;
    }
    local_79 = 1;
  }
  else {
    local_79 = 0;
  }
LAB_00f8b428:
  this_01 = (ReferenceContextBuffers *)operator_new(0x78);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar6 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar4));
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_01,pPVar6,0,0,x_,y_,limits.extensionStr.field_2._8_4_);
  this->m_refBuffers = this_01;
  pRVar7 = (ReferenceContext *)operator_new(0x61b0);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_e8,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_110,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_138,this->m_refBuffers);
  sglr::ReferenceContext::ReferenceContext
            (pRVar7,(ReferenceContextLimits *)local_78,&local_e8,&local_110,&local_138);
  this->m_refContext = pRVar7;
  pAVar8 = (AttributePack *)operator_new(0x60);
  pTVar2 = (this->super_TestCase).super_TestNode.m_testCtx;
  pRVar1 = this->m_renderCtx;
  drawContext = this->m_glesContext;
  tcu::Vector<unsigned_int,_2>::Vector(&local_140,x_,y_);
  AttributePack::AttributePack
            (pAVar8,pTVar2,pRVar1,drawContext,&local_140,(bool)(local_79 & 1),true);
  this->m_glArrayPack = pAVar8;
  pAVar8 = (AttributePack *)operator_new(0x60);
  pTVar2 = (this->super_TestCase).super_TestNode.m_testCtx;
  pRVar1 = this->m_renderCtx;
  pRVar7 = this->m_refContext;
  tcu::Vector<unsigned_int,_2>::Vector(&local_148,x_,y_);
  AttributePack::AttributePack
            (pAVar8,pTVar2,pRVar1,&pRVar7->super_Context,&local_148,(bool)(local_79 & 1),false);
  this->m_rrArrayPack = pAVar8;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar6 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_03,iVar4));
  dVar5 = deCeilFloatToInt32((6.0 / (float)(1 << ((byte)pPVar6->redBits & 0x1f))) * 256.0);
  this->m_maxDiffRed = dVar5;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar6 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_04,iVar4));
  dVar5 = deCeilFloatToInt32((6.0 / (float)(1 << ((byte)pPVar6->greenBits & 0x1f))) * 256.0);
  this->m_maxDiffGreen = dVar5;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar6 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_05,iVar4));
  dVar5 = deCeilFloatToInt32((6.0 / (float)(1 << ((byte)pPVar6->blueBits & 0x1f))) * 256.0);
  this->m_maxDiffBlue = dVar5;
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)local_78);
  return extraout_EAX;
}

Assistant:

void DrawTest::init (void)
{
	DE_ASSERT(!m_specs.empty());
	DE_ASSERT(contextSupports(m_renderCtx.getType(), m_specs[0].apiType));

	const int						renderTargetWidth	= de::min(MAX_RENDER_TARGET_SIZE, m_renderCtx.getRenderTarget().getWidth());
	const int						renderTargetHeight	= de::min(MAX_RENDER_TARGET_SIZE, m_renderCtx.getRenderTarget().getHeight());

	// lines have significantly different rasterization in MSAA mode
	const bool						isLineCase			= containsLineCases(m_specs);
	const bool						isMSAACase			= m_renderCtx.getRenderTarget().getNumSamples() > 1;
	const int						renderTargetSamples	= (isMSAACase && isLineCase) ? (4) : (1);

	sglr::ReferenceContextLimits	limits				(m_renderCtx);
	bool							useVao				= false;

	m_glesContext = new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));

	if (m_renderCtx.getType().getAPI() == glu::ApiType::es(2,0) || m_renderCtx.getType().getAPI() == glu::ApiType::es(3,0))
		useVao = false;
	else if (contextSupports(m_renderCtx.getType(), glu::ApiType::es(3,1)) || glu::isContextTypeGLCore(m_renderCtx.getType()))
		useVao = true;
	else
		DE_FATAL("Unknown context type");

	m_refBuffers	= new sglr::ReferenceContextBuffers(m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, renderTargetWidth, renderTargetHeight, renderTargetSamples);
	m_refContext	= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());

	m_glArrayPack	= new AttributePack(m_testCtx, m_renderCtx, *m_glesContext, tcu::UVec2(renderTargetWidth, renderTargetHeight), useVao, true);
	m_rrArrayPack	= new AttributePack(m_testCtx, m_renderCtx, *m_refContext,  tcu::UVec2(renderTargetWidth, renderTargetHeight), useVao, false);

	m_maxDiffRed	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().redBits)));
	m_maxDiffGreen	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().greenBits)));
	m_maxDiffBlue	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().blueBits)));
}